

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIndent.cxx
# Opt level: O1

string * __thiscall
kws::Parser::ExtractLine_abi_cxx11_(string *__return_storage_ptr__,Parser *this,size_t pos)

{
  ulong uVar1;
  
  uVar1 = std::__cxx11::string::find((char *)&this->m_Buffer,0x16b512,pos);
  if (pos < uVar1) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->m_Buffer);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::ExtractLine(size_t pos)
{
  size_t p = m_Buffer.find("\n",pos);
  if(p>pos)
    {
    return m_Buffer.substr(pos,p-pos-1);
    }
  return "";
}